

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::cp_mr(GB *this,u16 mr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  
  if ((this->s).op_tick == 0xe) {
    bVar2 = Read(this,mr);
    bVar1 = (this->s).field_2.field_0.a;
    uVar4 = (uint)bVar1 - (uint)bVar2;
    bVar3 = (byte)uVar4;
    (this->s).field_2.field_0.f =
         ((bVar3 != 0) << 7 | (byte)(uVar4 >> 4) & 0x10 | (bVar2 ^ bVar1 ^ bVar3) * '\x02' & 0x20) -
         0x40;
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::cp_mr(u16 mr) {
  switch (s.op_tick) {
    case 14: sub(Read(mr)); op_done(); break;
  }
}